

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

bool __thiscall
libcellml::Validator::ValidatorImpl::hasTwoMathmlChildren
          (ValidatorImpl *this,XmlNodePtr *node,ComponentPtr *component)

{
  size_t sVar1;
  element_type *this_00;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  ComponentPtr *local_28;
  ComponentPtr *component_local;
  XmlNodePtr *node_local;
  ValidatorImpl *this_local;
  
  local_28 = component;
  component_local = (ComponentPtr *)node;
  node_local = (XmlNodePtr *)this;
  sVar1 = mathmlChildCount(node);
  if (sVar1 != 2) {
    this_00 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)component_local);
    XmlNode::name_abi_cxx11_(&local_88,this_00);
    std::operator+(&local_68,"Math has a \'",&local_88);
    std::operator+(&local_48,&local_68,"\' element without exactly two MathML children.");
    addMathmlIssue(this,&local_48,MATH_MATHML,local_28);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return sVar1 == 2;
}

Assistant:

bool Validator::ValidatorImpl::hasTwoMathmlChildren(const XmlNodePtr &node,
                                                    const ComponentPtr &component)
{
    if (mathmlChildCount(node) != 2) {
        addMathmlIssue("Math has a '" + node->name() + "' element without exactly two MathML children.",
                       Issue::ReferenceRule::MATH_MATHML,
                       component);

        return false;
    }

    return true;
}